

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

bool __thiscall duckdb::Node::MergeNodes(Node *this,ART *art,Node *other,GateStatus status)

{
  idx_t iVar1;
  idx_t iVar2;
  bool bVar3;
  undefined7 in_register_00000009;
  byte bVar4;
  Node __tmp;
  uint8_t byte;
  undefined8 uStack_8;
  
  uStack_8 = CONCAT71(in_register_00000009,status) & 0xffffffff;
  iVar1 = (this->super_IndexPointer).data;
  bVar4 = (byte)(iVar1 >> 0x38) & 0x7f;
  iVar2 = (other->super_IndexPointer).data;
  if (bVar4 < ((byte)(iVar2 >> 0x38) & 0x7f)) {
    (this->super_IndexPointer).data = iVar2;
    (other->super_IndexPointer).data = iVar1;
    bVar4 = *(byte *)((long)&(this->super_IndexPointer).data + 7) & 0x7f;
  }
  if ((byte)(bVar4 - 3) < 4) {
    bVar3 = MergeNormalNodes(this,art,this,other,(uint8_t *)((long)&uStack_8 + 7),
                             (GateStatus)uStack_8);
  }
  else {
    MergeLeafNodes(this,art,this,other,(uint8_t *)((long)&uStack_8 + 7));
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

bool Node::MergeNodes(ART &art, Node &other, GateStatus status) {
	// Merge the smaller node into the bigger node.
	if (GetType() < other.GetType()) {
		swap(*this, other);
	}

	uint8_t byte = 0;
	if (IsNode()) {
		return MergeNormalNodes(art, *this, other, byte, status);
	}
	MergeLeafNodes(art, *this, other, byte);
	return true;
}